

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

void __thiscall internalJSONNode::internalJSONNode(internalJSONNode *this,json_string *unparsed)

{
  char *pcVar1;
  jsonChildren *pjVar2;
  json_string *unparsed_local;
  internalJSONNode *this_local;
  
  this->_type = '\0';
  std::__cxx11::string::string((string *)&this->_name);
  this->_name_encoded = false;
  std::__cxx11::string::string((string *)&this->_string,(string *)unparsed);
  this->_string_encoded = false;
  (this->_value)._number = 0.0;
  this->refcount = 1;
  this->fetched = false;
  this->Children = (jsonChildren *)0x0;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)unparsed);
  if (*pcVar1 == '[') {
    this->_type = '\x04';
    pjVar2 = jsonChildren::newChildren();
    this->Children = pjVar2;
  }
  else if (*pcVar1 == '{') {
    this->_type = '\x05';
    pjVar2 = jsonChildren::newChildren();
    this->Children = pjVar2;
  }
  else {
    Nullify(this);
  }
  return;
}

Assistant:

internalJSONNode::internalJSONNode(const json_string & unparsed) json_nothrow : _type(), _name(),_name_encoded(false), _string(unparsed), _string_encoded(), _value()
    initializeMutex(0)
    initializeRefCount(1)
    initializeFetch(false)
    initializeComment(json_global(EMPTY_JSON_STRING))
    initializeChildren(0){

    LIBJSON_CTOR;
    switch (unparsed[0]){
	   case JSON_TEXT('{'):  //node
		  _type = JSON_NODE;
		  CHILDREN = jsonChildren::newChildren();
		  #ifdef JSON_PREPARSE
			 FetchNode();
		  #endif
		  break;
	   case JSON_TEXT('['):  //array
		  _type = JSON_ARRAY;
		  CHILDREN = jsonChildren::newChildren();
		  #ifdef JSON_PREPARSE
			 FetchArray();
		  #endif
		  break;
	   default:
		  JSON_FAIL_SAFE(JSON_TEXT("root not starting with either { or ["), Nullify(););
		  break;
    }
}